

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O2

size_t __thiscall
cappuccino::lru_cache<unsigned_long,unsigned_long,(cappuccino::thread_safe)0>::
insert_range<std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
          (lru_cache<unsigned_long,unsigned_long,(cappuccino::thread_safe)0> *this,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *key_value_range,allow a)

{
  pointer ppVar1;
  bool bVar2;
  size_t sVar3;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> guard;
  type *key;
  pointer key_00;
  
  ppVar1 = (key_value_range->
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar3 = 0;
  for (key_00 = (key_value_range->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start; key_00 != ppVar1; key_00 = key_00 + 1) {
    bVar2 = lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)0>::do_insert_update
                      ((lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)0> *)this,
                       &key_00->first,&key_00->second,a);
    sVar3 = sVar3 + bVar2;
  }
  return sVar3;
}

Assistant:

auto insert_range(range_type&& key_value_range, allow a = allow::insert_or_update) -> size_t
    {
        size_t inserted{0};

        {
            std::lock_guard guard{m_lock};
            for (auto& [key, value] : key_value_range)
            {
                if (do_insert_update(key, std::move(value), a))
                {
                    ++inserted;
                }
            }
        }

        return inserted;
    }